

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::jpg_error_handler(j_common_ptr param_1)

{
  Exception *this;
  allocator local_31;
  string local_30 [32];
  j_common_ptr local_10;
  j_common_ptr param_0_local;
  
  local_10 = param_1;
  this = (Exception *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"JPEG format not recognized",&local_31);
  util::Exception::Exception(this,(string *)local_30);
  __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
jpg_error_handler (j_common_ptr /*cinfo*/)
{
    throw util::Exception("JPEG format not recognized");
}